

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O1

bool __thiscall
Assimp::Ogre::OgreXmlSerializer::CurrentNodeNameEquals(OgreXmlSerializer *this,string *name)

{
  char *__s1;
  char *__s2;
  int iVar1;
  bool bVar2;
  
  if ((int)name->_M_string_length == (int)(this->m_currentNodeName)._M_string_length) {
    __s1 = (this->m_currentNodeName)._M_dataplus._M_p;
    if (__s1 == (char *)0x0) {
      __assert_fail("__null != s1",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                    ,0x8f,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    __s2 = (name->_M_dataplus)._M_p;
    if (__s2 == (char *)0x0) {
      __assert_fail("__null != s2",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/hbina[P]fatuous/thirdparty/assimp/include/assimp/StringComparison.h"
                    ,0x90,"int Assimp::ASSIMP_stricmp(const char *, const char *)");
    }
    iVar1 = strcasecmp(__s1,__s2);
    bVar2 = iVar1 == 0;
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool OgreXmlSerializer::CurrentNodeNameEquals(const std::string &name) const
{
    return (ASSIMP_stricmp(m_currentNodeName, name) == 0);
}